

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ConstantPaddingLayerParams::InternalSwap
          (ConstantPaddingLayerParams *this,ConstantPaddingLayerParams *other)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->padamounts_,&other->padamounts_);
  fVar1 = this->value_;
  this->value_ = other->value_;
  other->value_ = fVar1;
  bVar2 = this->padtogivenoutputsizemode_;
  this->padtogivenoutputsizemode_ = other->padtogivenoutputsizemode_;
  other->padtogivenoutputsizemode_ = bVar2;
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void ConstantPaddingLayerParams::InternalSwap(ConstantPaddingLayerParams* other) {
  padamounts_.InternalSwap(&other->padamounts_);
  std::swap(value_, other->value_);
  std::swap(padtogivenoutputsizemode_, other->padtogivenoutputsizemode_);
  std::swap(_cached_size_, other->_cached_size_);
}